

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O0

Label __thiscall asmjit::v1_14::BaseBuilder::newLabel(BaseBuilder *this)

{
  Error EVar1;
  CodeHolder *in_RSI;
  LabelEntry **in_RDI;
  Label LVar2;
  LabelEntry *le;
  uint32_t labelId;
  LabelEntry **ppLVar3;
  BaseBuilder *in_stack_ffffffffffffff98;
  ValidationFlags local_5c;
  
  local_5c = ~kNone;
  ppLVar3 = in_RDI;
  if (in_RSI->_logger != (Logger *)0x0) {
    EVar1 = CodeHolder::newLabelEntry(in_RSI,in_RDI);
    if (EVar1 == 0) {
      EVar1 = BaseBuilder_newLabelInternal
                        (in_stack_ffffffffffffff98,(uint32_t)((ulong)in_RSI >> 0x20));
      if (EVar1 == 0) {
        local_5c = (in_stack_ffffffffffffff98->super_BaseEmitter)._validationFlags;
      }
    }
  }
  *(undefined4 *)in_RDI = 5;
  *(ValidationFlags *)((long)in_RDI + 4) = local_5c;
  *(undefined4 *)(in_RDI + 1) = 0;
  *(undefined4 *)((long)in_RDI + 0xc) = 0;
  LVar2.super_Operand.super_Operand_._data[0] = 0;
  LVar2.super_Operand.super_Operand_._data[1] = 0;
  LVar2.super_Operand.super_Operand_._0_8_ = ppLVar3;
  return (Label)LVar2.super_Operand.super_Operand_;
}

Assistant:

Label BaseBuilder::newLabel() {
  uint32_t labelId = Globals::kInvalidId;
  LabelEntry* le;

  if (_code &&
      _code->newLabelEntry(&le) == kErrorOk &&
      BaseBuilder_newLabelInternal(this, le->id()) == kErrorOk) {
    labelId = le->id();
  }

  return Label(labelId);
}